

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O2

int get_crl_sk(X509_STORE_CTX *ctx,X509_CRL **pcrl,X509 **pissuer,int *pscore,
              stack_st_X509_CRL *crls)

{
  uint uVar1;
  X509 *a;
  DIST_POINT_NAME *pDVar2;
  OPENSSL_STACK *sk;
  X509_CRL **ppXVar3;
  int iVar4;
  int iVar5;
  size_t sVar6;
  X509_CRL *crl;
  X509_NAME *pXVar7;
  X509_NAME *pXVar8;
  X509 *issuer;
  size_t sVar9;
  long *plVar10;
  GENERAL_NAME *a_00;
  GENERAL_NAME *b;
  int *piVar11;
  ASN1_TIME *from;
  ASN1_TIME *to;
  uint uVar12;
  ulong i;
  ulong uVar13;
  ulong i_00;
  long lVar14;
  uint local_a0;
  X509_CRL *local_98;
  X509_NAME *local_90;
  X509 *local_80;
  DIST_POINT_NAME *local_78;
  int sec;
  int day;
  ulong local_58;
  OPENSSL_STACK *local_50;
  X509_CRL **local_48;
  X509 **local_40;
  uint *local_38;
  
  local_a0 = *pscore;
  a = (X509 *)ctx->current_cert;
  local_98 = (X509_CRL *)0x0;
  local_80 = (X509 *)0x0;
  i_00 = 0;
  local_50 = (OPENSSL_STACK *)crls;
  local_48 = pcrl;
  local_40 = pissuer;
  local_38 = (uint *)pscore;
  do {
    sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)crls);
    ppXVar3 = local_48;
    if (sVar6 <= i_00) {
      if (local_98 != (X509_CRL *)0x0) {
        if ((X509_CRL *)*local_48 != (X509_CRL *)0x0) {
          X509_CRL_free((X509_CRL *)*local_48);
        }
        *ppXVar3 = local_98;
        *local_40 = (X509 *)local_80;
        *local_38 = local_a0;
        X509_CRL_up_ref(local_98);
      }
      return (int)(0x1bf < (int)local_a0);
    }
    crl = (X509_CRL *)OPENSSL_sk_value((OPENSSL_STACK *)crls,i_00);
    if ((crl->idp_flags & 0x62) == 0) {
      pXVar7 = X509_get_issuer_name(a);
      pXVar8 = X509_CRL_get_issuer(crl);
      iVar4 = X509_NAME_cmp(pXVar7,(X509_NAME *)pXVar8);
      if (iVar4 == 0) {
        uVar1 = crl->flags;
        iVar4 = check_crl_time(ctx,crl,0);
        pXVar8 = X509_CRL_get_issuer(crl);
        lVar14 = (long)ctx->error_depth;
        sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
        issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,
                                          (ulong)(sVar6 - 1 != lVar14) + lVar14);
        iVar5 = X509_check_akid(issuer,(AUTHORITY_KEYID *)crl->akid);
        crls = (stack_st_X509_CRL *)local_50;
        if (iVar5 == 0) {
          uVar12 = 0x1c;
        }
        else {
          sVar6 = lVar14 + (ulong)(sVar6 - 1 != lVar14);
          do {
            sVar6 = sVar6 + 1;
            sVar9 = OPENSSL_sk_num((OPENSSL_STACK *)ctx->chain);
            if ((long)(int)sVar9 <= (long)sVar6) goto LAB_00193a05;
            issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)ctx->chain,sVar6);
            pXVar7 = X509_get_subject_name(issuer);
            iVar5 = X509_NAME_cmp(pXVar7,(X509_NAME *)pXVar8);
          } while ((iVar5 != 0) ||
                  (iVar5 = X509_check_akid(issuer,(AUTHORITY_KEYID *)crl->akid), iVar5 != 0));
          uVar12 = 0xc;
        }
        uVar12 = (uint)((uVar1 >> 9 & 1) == 0) * 0x100 + iVar4 * 0x40 + 0x20 | uVar12;
        uVar1 = crl->idp_flags;
        if ((uVar1 & 0x10) == 0) {
          if (((a->ex_data).dummy & 0x10) == 0) {
            uVar1 = uVar1 & 8;
          }
          else {
            uVar1 = uVar1 & 4;
          }
          if (uVar1 == 0) {
            for (i = 0; sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)a->ex_kusage), i < sVar6; i = i + 1)
            {
              plVar10 = (long *)OPENSSL_sk_value((OPENSSL_STACK *)a->ex_kusage,i);
              if ((plVar10[1] == 0) && (plVar10[2] == 0)) {
                if ((crl->idp == (ISSUING_DIST_POINT *)0x0) ||
                   ((pDVar2 = (DIST_POINT_NAME *)*plVar10, pDVar2 == (DIST_POINT_NAME *)0x0 ||
                    (local_78 = crl->idp->distpoint, local_78 == (DIST_POINT_NAME *)0x0))))
                goto LAB_0019397d;
                if (pDVar2->type == 1) {
                  local_90 = pDVar2->dpname;
                  if (local_90 != (X509_NAME *)0x0) {
                    if (local_78->type == 1) {
                      if ((local_78->dpname != (X509_NAME *)0x0) &&
                         (iVar4 = X509_NAME_cmp((X509_NAME *)local_90,(X509_NAME *)local_78->dpname)
                         , iVar4 == 0)) goto LAB_0019397d;
                    }
                    else {
LAB_00193919:
                      sk = (OPENSSL_STACK *)(local_78->name).fullname;
                      for (uVar13 = 0; sVar6 = OPENSSL_sk_num(sk), uVar13 < sVar6;
                          uVar13 = uVar13 + 1) {
                        piVar11 = (int *)OPENSSL_sk_value(sk,uVar13);
                        if ((*piVar11 == 4) &&
                           (iVar4 = X509_NAME_cmp((X509_NAME *)local_90,*(X509_NAME **)(piVar11 + 2)
                                                 ), iVar4 == 0)) goto LAB_0019397d;
                      }
                    }
                  }
                }
                else if (local_78->type == 1) {
                  local_90 = local_78->dpname;
                  local_78 = pDVar2;
                  if (local_90 != (X509_NAME *)0x0) goto LAB_00193919;
                }
                else {
                  uVar13 = 0;
                  while (sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)(pDVar2->name).fullname),
                        local_58 = uVar13, uVar13 < sVar6) {
                    a_00 = (GENERAL_NAME *)
                           OPENSSL_sk_value((OPENSSL_STACK *)(pDVar2->name).fullname,uVar13);
                    uVar13 = 0;
                    while (sVar6 = OPENSSL_sk_num((OPENSSL_STACK *)(local_78->name).fullname),
                          uVar13 < sVar6) {
                      b = (GENERAL_NAME *)
                          OPENSSL_sk_value((OPENSSL_STACK *)(local_78->name).fullname,uVar13);
                      iVar4 = GENERAL_NAME_cmp(a_00,b);
                      uVar13 = uVar13 + 1;
                      if (iVar4 == 0) goto LAB_0019397d;
                    }
                    uVar13 = local_58 + 1;
                  }
                }
              }
            }
            if ((crl->idp == (ISSUING_DIST_POINT *)0x0) ||
               (crl->idp->distpoint == (DIST_POINT_NAME *)0x0)) {
LAB_0019397d:
              uVar12 = uVar12 | 0x80;
            }
          }
        }
        if ((int)local_a0 <= (int)uVar12) {
          if ((uVar12 == local_a0) && (local_98 != (X509_CRL *)0x0)) {
            from = X509_CRL_get0_lastUpdate(local_98);
            to = X509_CRL_get0_lastUpdate(crl);
            iVar4 = ASN1_TIME_diff(&day,&sec,from,to);
            if ((iVar4 == 0) || ((day < 1 && (sec < 1)))) goto LAB_00193a05;
          }
          local_a0 = uVar12;
          local_98 = crl;
          local_80 = issuer;
        }
      }
    }
LAB_00193a05:
    i_00 = i_00 + 1;
  } while( true );
}

Assistant:

static int get_crl_sk(X509_STORE_CTX *ctx, X509_CRL **pcrl, X509 **pissuer,
                      int *pscore, STACK_OF(X509_CRL) *crls) {
  int crl_score, best_score = *pscore;
  X509 *x = ctx->current_cert;
  X509_CRL *best_crl = NULL;
  X509 *crl_issuer = NULL, *best_crl_issuer = NULL;

  for (size_t i = 0; i < sk_X509_CRL_num(crls); i++) {
    X509_CRL *crl = sk_X509_CRL_value(crls, i);
    crl_score = get_crl_score(ctx, &crl_issuer, crl, x);
    if (crl_score < best_score || crl_score == 0) {
      continue;
    }
    // If current CRL is equivalent use it if it is newer
    if (crl_score == best_score && best_crl != NULL) {
      int day, sec;
      if (ASN1_TIME_diff(&day, &sec, X509_CRL_get0_lastUpdate(best_crl),
                         X509_CRL_get0_lastUpdate(crl)) == 0) {
        continue;
      }
      // ASN1_TIME_diff never returns inconsistent signs for |day|
      // and |sec|.
      if (day <= 0 && sec <= 0) {
        continue;
      }
    }
    best_crl = crl;
    best_crl_issuer = crl_issuer;
    best_score = crl_score;
  }

  if (best_crl) {
    if (*pcrl) {
      X509_CRL_free(*pcrl);
    }
    *pcrl = best_crl;
    *pissuer = best_crl_issuer;
    *pscore = best_score;
    X509_CRL_up_ref(best_crl);
  }

  if (best_score >= CRL_SCORE_VALID) {
    return 1;
  }

  return 0;
}